

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcTopologyRepresentation::~IfcTopologyRepresentation
          (IfcTopologyRepresentation *this)

{
  _func_int *p_Var1;
  _func_int *p_Var2;
  void *pvVar3;
  
  p_Var2 = (this->super_IfcShapeModel).super_IfcRepresentation.
           super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentation,_4UL>._vptr_ObjectHelper
           [-3];
  p_Var1 = (_func_int *)
           ((long)&(this->super_IfcShapeModel).super_IfcRepresentation.
                   super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentation,_4UL>.
                   _vptr_ObjectHelper + (long)p_Var2);
  *(undefined8 *)
   ((long)&(this->super_IfcShapeModel).super_IfcRepresentation.
           super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentation,_4UL>._vptr_ObjectHelper +
   (long)p_Var2) = 0x80a6b0;
  *(undefined8 *)(&(this->super_IfcShapeModel).field_0xa0 + (long)p_Var2) = 0x80a6d8;
  pvVar3 = *(void **)(p_Var2 + (long)&(this->super_IfcShapeModel).super_IfcRepresentation.Items.
                                      super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>_>_>
                                      .
                                      super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>_>_>
                     );
  if (pvVar3 != (void *)0x0) {
    operator_delete(pvVar3,*(long *)(p_Var1 + 0x78) - (long)pvVar3);
  }
  if (*(code **)(p_Var1 + 0x40) != p_Var1 + 0x50) {
    operator_delete(*(code **)(p_Var1 + 0x40),*(long *)(p_Var1 + 0x50) + 1);
  }
  if (*(code **)(p_Var1 + 0x18) != p_Var1 + 0x28) {
    operator_delete(*(code **)(p_Var1 + 0x18),*(long *)(p_Var1 + 0x28) + 1);
  }
  operator_delete(p_Var1,0xb8);
  return;
}

Assistant:

IfcTopologyRepresentation() : Object("IfcTopologyRepresentation") {}